

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode Curl_socket_open(Curl_easy *data,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,int transport,
                         curl_socket_t *sockfd)

{
  CURLcode CVar1;
  undefined1 local_c0 [8];
  Curl_sockaddr_ex dummy;
  curl_socket_t *sockfd_local;
  Curl_sockaddr_ex *pCStack_20;
  int transport_local;
  Curl_sockaddr_ex *addr_local;
  Curl_addrinfo *ai_local;
  Curl_easy *data_local;
  
  pCStack_20 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCStack_20 = (Curl_sockaddr_ex *)local_c0;
  }
  dummy._sa_ex_u._120_8_ = sockfd;
  Curl_sock_assign_addr(pCStack_20,ai,transport);
  CVar1 = socket_open(data,pCStack_20,(curl_socket_t *)dummy._sa_ex_u._120_8_);
  return CVar1;
}

Assistant:

CURLcode Curl_socket_open(struct Curl_easy *data,
                            const struct Curl_addrinfo *ai,
                            struct Curl_sockaddr_ex *addr,
                            int transport,
                            curl_socket_t *sockfd)
{
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  Curl_sock_assign_addr(addr, ai, transport);
  return socket_open(data, addr, sockfd);
}